

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.h
# Opt level: O2

LiteralExpr * __thiscall
SQASTReader::newNode<SQCompilation::LiteralExpr,bool>(SQASTReader *this,bool args)

{
  LiteralExpr *pLVar1;
  undefined7 in_register_00000031;
  
  pLVar1 = (LiteralExpr *)Arena::allocatePull(this->astArena,0x28);
  *(undefined8 *)&pLVar1->field_0x18 = 0x300000039;
  *(undefined4 *)&pLVar1->field_0x8 = 0xffffffff;
  *(undefined4 *)&pLVar1->field_0xc = 0xffffffff;
  *(undefined4 *)&pLVar1->field_0x10 = 0xffffffff;
  *(undefined4 *)&pLVar1->field_0x14 = 0xffffffff;
  *(undefined ***)pLVar1 = &PTR__ArenaObj_00199d28;
  (pLVar1->_v).raw = CONCAT71(in_register_00000031,args) & 0xffffffff;
  return pLVar1;
}

Assistant:

N *newNode(Args... args) {
    return new (astArena) N(args...);
  }